

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::TreePop(void)

{
  ImU32 *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  value_type_conflict2 *pvVar5;
  uint uVar6;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  Unindent(0.0);
  uVar6 = (pIVar2->DC).TreeDepth - 1;
  (pIVar2->DC).TreeDepth = uVar6;
  if ((pIVar3->NavMoveDir == 0) && (pIVar3->NavWindow == pIVar2)) {
    bVar4 = NavMoveRequestButNoResultYet();
    if ((bVar4) &&
       ((pIVar3->NavIdIsAlive == true &&
        (((pIVar2->DC).TreeDepthMayJumpToParentOnPop >> (uVar6 & 0x1f) & 1) != 0)))) {
      pvVar5 = ImVector<unsigned_int>::back(&pIVar2->IDStack);
      SetNavID(*pvVar5,pIVar3->NavLayer);
      NavMoveRequestCancel();
      uVar6 = (pIVar2->DC).TreeDepth;
    }
  }
  pIVar1 = &(pIVar2->DC).TreeDepthMayJumpToParentOnPop;
  *pIVar1 = *pIVar1 & ~(-1 << ((byte)uVar6 & 0x1f));
  PopID();
  return;
}

Assistant:

void ImGui::TreePop()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Unindent();

    window->DC.TreeDepth--;
    if (g.NavMoveDir == ImGuiDir_Left && g.NavWindow == window && NavMoveRequestButNoResultYet())
        if (g.NavIdIsAlive && (window->DC.TreeDepthMayJumpToParentOnPop & (1 << window->DC.TreeDepth)))
        {
            SetNavID(window->IDStack.back(), g.NavLayer);
            NavMoveRequestCancel();
        }
    window->DC.TreeDepthMayJumpToParentOnPop &= (1 << window->DC.TreeDepth) - 1;

    PopID();
}